

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

int sprkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                   ARKVecResizeFn resize,void *resize_data)

{
  ARKodeSPRKStepMem pAVar1;
  int iVar2;
  N_Vector *v;
  long lrw_diff;
  long liw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar2 = sprkStep_AccessStepMem(ark_mem,"sprkStep_Resize",&step_mem);
  if (iVar2 != 0) {
    return iVar2;
  }
  liw1 = 0;
  lrw1 = 0;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  pAVar1 = step_mem;
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  iVar2 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->sdata);
  if (iVar2 == 0) {
    iVar2 = 0x108;
  }
  else {
    if (pAVar1->yerr == (N_Vector)0x0) {
      return 0;
    }
    v = &pAVar1->yerr;
    iVar2 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,v);
    if (iVar2 != 0) {
      N_VConst(0,*v);
      return 0;
    }
    iVar2 = 0x112;
  }
  arkProcessError(ark_mem,-0x14,iVar2,"sprkStep_Resize",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                  ,"Unable to resize vector");
  return -0x14;
}

Assistant:

int sprkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                    SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                    SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                    void* resize_data)
{
  ARKodeSPRKStepMem step_mem = NULL;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the local vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &step_mem->sdata))
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  if (step_mem->yerr)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->yerr))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
    /* Zero yerr for compensated summation */
    N_VConst(ZERO, step_mem->yerr);
  }

  return (ARK_SUCCESS);
}